

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# normalizer2impl.cpp
# Opt level: O1

UChar * __thiscall
icu_63::Normalizer2Impl::composeQuickCheck
          (Normalizer2Impl *this,UChar *src,UChar *limit,UBool onlyContiguous,
          UNormalizationCheckResult *pQCResult)

{
  UChar UVar1;
  UChar UVar2;
  UChar UVar3;
  UCPTrie *pUVar4;
  void *pvVar5;
  bool bVar6;
  UBool UVar7;
  byte bVar8;
  ushort uVar9;
  uint uVar10;
  UChar *in_RAX;
  undefined7 extraout_var;
  UChar *pUVar11;
  char cVar12;
  ushort uVar13;
  ushort uVar14;
  UChar *pUVar15;
  int iVar16;
  UChar *pUVar17;
  long lVar18;
  bool bVar19;
  UChar *local_50;
  
  UVar1 = this->minCompNoMaybeCP;
  pUVar17 = src;
  local_50 = src;
  if (limit == (UChar *)0x0) {
    lVar18 = 2;
    pUVar11 = src + -2;
    do {
      pUVar17 = pUVar11;
      pUVar11 = pUVar17 + 1;
      lVar18 = lVar18 + -2;
      if (pUVar17[2] == L'\0') break;
    } while ((ushort)pUVar17[2] < (ushort)UVar1);
    pUVar17 = pUVar17 + 2;
    limit = u_strchr_63(pUVar17,L'\0');
    in_RAX = limit;
    local_50 = src;
    if (lVar18 != 0) {
      UVar7 = hasCompBoundaryAfter(this,(uint)(ushort)*pUVar11,onlyContiguous);
      in_RAX = (UChar *)CONCAT71(extraout_var,UVar7);
      local_50 = pUVar17;
      if (UVar7 == '\0') {
        pUVar17 = pUVar11;
        local_50 = pUVar11;
      }
    }
  }
LAB_00297a38:
  pUVar11 = pUVar17;
  if (pUVar11 == limit) {
    bVar19 = false;
    pUVar17 = pUVar11;
  }
  else {
    do {
      UVar2 = *pUVar11;
      if ((ushort)UVar2 < (ushort)UVar1) {
LAB_00297a78:
        pUVar17 = pUVar11 + 1;
      }
      else {
        pUVar4 = this->normTrie;
        pvVar5 = (pUVar4->data).ptr0;
        uVar13 = *(ushort *)
                  ((long)pvVar5 +
                  (ulong)(((ushort)UVar2 & 0x3f) + (uint)pUVar4->index[(ushort)UVar2 >> 6]) * 2);
        if (uVar13 < this->minNoNo) goto LAB_00297a78;
        pUVar17 = pUVar11 + 1;
        if (((ushort)UVar2 & 0xfc00) != 0xd800) {
LAB_00297b1a:
          uVar10 = 1;
          pUVar15 = local_50;
          if (((local_50 != pUVar11) &&
              (uVar10 = 1, pUVar15 = pUVar11, this->minNoNoCompNoMaybeCC <= uVar13)) &&
             ((uVar13 < this->limitNoNo || (this->minMaybeYes <= uVar13)))) {
            pUVar15 = pUVar11 + -1;
            UVar2 = pUVar11[-1];
            if ((UVar2 & 0xf800U) == 0xd800) {
              if (((((ushort)UVar2 >> 10 & 1) == 0) || (pUVar15 == local_50)) ||
                 ((pUVar11[-2] & 0xfc00U) != 0xd800)) {
                iVar16 = this->normTrie->dataLength + -1;
              }
              else {
                pUVar15 = pUVar11 + -2;
                iVar16 = (uint)(ushort)UVar2 + (uint)(ushort)pUVar11[-2] * 0x400 + -0x35fdc00;
                pUVar4 = this->normTrie;
                if (iVar16 < pUVar4->highStart) {
                  iVar16 = ucptrie_internalSmallIndex_63(pUVar4,iVar16);
                }
                else {
                  iVar16 = pUVar4->dataLength + -2;
                }
              }
            }
            else {
              iVar16 = ((ushort)UVar2 & 0x3f) + (uint)this->normTrie->index[(ushort)UVar2 >> 6];
            }
            uVar14 = *(ushort *)((long)(this->normTrie->data).ptr0 + (long)iVar16 * 2);
            bVar19 = (uVar14 & 1) == 0;
            uVar10 = (uint)uVar14;
            if (onlyContiguous != '\0' && !bVar19) {
              bVar19 = true;
              if (uVar10 != 1) {
                if (uVar14 < this->limitNoNo) {
                  bVar19 = *(ushort *)((long)this->extraData + (ulong)(uVar10 & 0xfffffffe)) < 0x200
                  ;
                }
                else {
                  bVar19 = (uVar14 & 6) < 3;
                }
              }
              bVar19 = (bool)(bVar19 ^ 1);
            }
            if (!bVar19) {
              uVar10 = 1;
              pUVar15 = pUVar11;
            }
          }
          local_50 = pUVar15;
          if (uVar13 < this->minMaybeYes) goto LAB_00297dbf;
          uVar14 = uVar13 >> 1;
          if (uVar13 < 0xfc00) {
            uVar14 = 0;
          }
          if ((onlyContiguous == '\0') || ((byte)uVar14 == 0)) goto LAB_00297c90;
          cVar12 = '\0';
          bVar8 = 0;
          if (this->minYesNo < (ushort)uVar10) {
            bVar8 = *(byte *)((long)this->extraData + (ulong)(uVar10 & 0xfffe) + 1);
          }
          if (bVar8 <= (byte)uVar14) goto LAB_00297c90;
          goto LAB_00297dbb;
        }
        bVar19 = true;
        if ((pUVar17 != limit) && ((*pUVar17 & 0xfc00U) == 0xdc00)) {
          iVar16 = (uint)(ushort)UVar2 * 0x400 + (uint)(ushort)*pUVar17 + -0x35fdc00;
          if (iVar16 < pUVar4->highStart) {
            iVar16 = ucptrie_internalSmallIndex_63(pUVar4,iVar16);
          }
          else {
            iVar16 = pUVar4->dataLength + -2;
          }
          pUVar17 = pUVar11 + 2;
          uVar13 = *(ushort *)((long)pvVar5 + (long)iVar16 * 2);
          bVar19 = uVar13 < this->minNoNo;
        }
        if (!bVar19) goto LAB_00297b1a;
      }
      pUVar11 = pUVar17;
    } while (pUVar11 != limit);
    bVar19 = false;
    pUVar17 = pUVar11;
  }
  goto LAB_00297dde;
  while( true ) {
    if (pUVar17 == limit) {
      cVar12 = '\x01';
      in_RAX = pUVar17;
      goto LAB_00297dbb;
    }
    pUVar11 = pUVar17 + 1;
    UVar2 = *pUVar17;
    if ((UVar2 & 0xf800U) == 0xd800) {
      if (((((ushort)UVar2 >> 10 & 1) == 0) && (pUVar11 != limit)) &&
         (UVar3 = *pUVar11, (UVar3 & 0xfc00U) == 0xdc00)) {
        pUVar11 = pUVar17 + 2;
        iVar16 = (uint)(ushort)UVar2 * 0x400 + (uint)(ushort)UVar3 + -0x35fdc00;
        pUVar4 = this->normTrie;
        if (iVar16 < pUVar4->highStart) {
          iVar16 = ucptrie_internalSmallIndex_63(pUVar4,iVar16);
        }
        else {
          iVar16 = pUVar4->dataLength + -2;
        }
      }
      else {
        iVar16 = this->normTrie->dataLength + -1;
      }
    }
    else {
      iVar16 = ((ushort)UVar2 & 0x3f) + (uint)this->normTrie->index[(ushort)UVar2 >> 6];
    }
    uVar13 = *(ushort *)((long)(this->normTrie->data).ptr0 + (long)iVar16 * 2);
    uVar9 = 0;
    bVar19 = false;
    pUVar15 = pUVar17;
    if (this->minMaybeYes <= uVar13) {
      if (0xfbff < uVar13) {
        uVar9 = uVar13 >> 1;
      }
      bVar8 = (byte)uVar9;
      bVar6 = (byte)uVar14 <= bVar8;
      bVar19 = bVar8 == 0 || bVar6;
      pUVar15 = pUVar11;
      uVar14 = uVar9;
      if (bVar8 != 0 && !bVar6) {
        pUVar15 = pUVar17;
      }
    }
    pUVar17 = pUVar15;
    if (!bVar19) break;
LAB_00297c90:
    if (uVar13 < 0xfe02) {
      if (pQCResult == (UNormalizationCheckResult *)0x0) {
        cVar12 = '\x01';
        in_RAX = local_50;
        goto LAB_00297dbb;
      }
      *pQCResult = UNORM_MAYBE;
    }
  }
  if (uVar13 < this->minNoNo) {
    pUVar17 = pUVar11;
    local_50 = pUVar15;
  }
  cVar12 = (uVar13 < this->minNoNo) * '\x03';
LAB_00297dbb:
  pUVar11 = in_RAX;
  if (cVar12 == '\0') {
LAB_00297dbf:
    cVar12 = '\x01';
    pUVar11 = local_50;
    if (pQCResult != (UNormalizationCheckResult *)0x0) {
      *pQCResult = UNORM_NO;
    }
  }
  bVar19 = cVar12 == '\x03';
LAB_00297dde:
  in_RAX = pUVar11;
  if (!bVar19) {
    return pUVar11;
  }
  goto LAB_00297a38;
}

Assistant:

const UChar *
Normalizer2Impl::composeQuickCheck(const UChar *src, const UChar *limit,
                                   UBool onlyContiguous,
                                   UNormalizationCheckResult *pQCResult) const {
    const UChar *prevBoundary=src;
    UChar32 minNoMaybeCP=minCompNoMaybeCP;
    if(limit==NULL) {
        UErrorCode errorCode=U_ZERO_ERROR;
        src=copyLowPrefixFromNulTerminated(src, minNoMaybeCP, NULL, errorCode);
        limit=u_strchr(src, 0);
        if (prevBoundary != src) {
            if (hasCompBoundaryAfter(*(src-1), onlyContiguous)) {
                prevBoundary = src;
            } else {
                prevBoundary = --src;
            }
        }
    }

    for(;;) {
        // Fast path: Scan over a sequence of characters below the minimum "no or maybe" code point,
        // or with (compYes && ccc==0) properties.
        const UChar *prevSrc;
        UChar32 c = 0;
        uint16_t norm16 = 0;
        for (;;) {
            if(src==limit) {
                return src;
            }
            if( (c=*src)<minNoMaybeCP ||
                isCompYesAndZeroCC(norm16=UCPTRIE_FAST_BMP_GET(normTrie, UCPTRIE_16, c))
            ) {
                ++src;
            } else {
                prevSrc = src++;
                if(!U16_IS_LEAD(c)) {
                    break;
                } else {
                    UChar c2;
                    if(src!=limit && U16_IS_TRAIL(c2=*src)) {
                        ++src;
                        c=U16_GET_SUPPLEMENTARY(c, c2);
                        norm16=UCPTRIE_FAST_SUPP_GET(normTrie, UCPTRIE_16, c);
                        if(!isCompYesAndZeroCC(norm16)) {
                            break;
                        }
                    }
                }
            }
        }
        // isCompYesAndZeroCC(norm16) is false, that is, norm16>=minNoNo.
        // The current character is either a "noNo" (has a mapping)
        // or a "maybeYes" (combines backward)
        // or a "yesYes" with ccc!=0.
        // It is not a Hangul syllable or Jamo L because those have "yes" properties.

        uint16_t prevNorm16 = INERT;
        if (prevBoundary != prevSrc) {
            if (norm16HasCompBoundaryBefore(norm16)) {
                prevBoundary = prevSrc;
            } else {
                const UChar *p = prevSrc;
                uint16_t n16;
                UCPTRIE_FAST_U16_PREV(normTrie, UCPTRIE_16, prevBoundary, p, c, n16);
                if (norm16HasCompBoundaryAfter(n16, onlyContiguous)) {
                    prevBoundary = prevSrc;
                } else {
                    prevBoundary = p;
                    prevNorm16 = n16;
                }
            }
        }

        if(isMaybeOrNonZeroCC(norm16)) {
            uint8_t cc=getCCFromYesOrMaybe(norm16);
            if (onlyContiguous /* FCC */ && cc != 0 &&
                    getTrailCCFromCompYesAndZeroCC(prevNorm16) > cc) {
                // The [prevBoundary..prevSrc[ character
                // passed the quick check "yes && ccc==0" test
                // but is out of canonical order with the current combining mark.
            } else {
                // If !onlyContiguous (not FCC), then we ignore the tccc of
                // the previous character which passed the quick check "yes && ccc==0" test.
                const UChar *nextSrc;
                for (;;) {
                    if (norm16 < MIN_YES_YES_WITH_CC) {
                        if (pQCResult != nullptr) {
                            *pQCResult = UNORM_MAYBE;
                        } else {
                            return prevBoundary;
                        }
                    }
                    if (src == limit) {
                        return src;
                    }
                    uint8_t prevCC = cc;
                    nextSrc = src;
                    UCPTRIE_FAST_U16_NEXT(normTrie, UCPTRIE_16, nextSrc, limit, c, norm16);
                    if (isMaybeOrNonZeroCC(norm16)) {
                        cc = getCCFromYesOrMaybe(norm16);
                        if (!(prevCC <= cc || cc == 0)) {
                            break;
                        }
                    } else {
                        break;
                    }
                    src = nextSrc;
                }
                // src is after the last in-order combining mark.
                if (isCompYesAndZeroCC(norm16)) {
                    prevBoundary = src;
                    src = nextSrc;
                    continue;
                }
            }
        }
        if(pQCResult!=NULL) {
            *pQCResult=UNORM_NO;
        }
        return prevBoundary;
    }
}